

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int balloc(bstring b,int olen)

{
  int iVar1;
  int iVar2;
  uchar *__ptr;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uchar *__dest;
  int iVar6;
  
  if (b == (bstring)0x0) {
    return -1;
  }
  __ptr = b->data;
  if (__ptr == (uchar *)0x0) {
    return -1;
  }
  iVar1 = b->slen;
  if ((long)iVar1 < 0) {
    return -1;
  }
  iVar2 = b->mlen;
  if (iVar2 < 1) {
    return -1;
  }
  if (olen < 1 || iVar2 < iVar1) {
    return -1;
  }
  if (olen < iVar2) {
    return 0;
  }
  iVar6 = 8;
  if ((7 < olen) &&
     (uVar4 = (uint)olen >> 1 | olen, uVar4 = uVar4 >> 2 | uVar4, uVar4 = uVar4 >> 4 | uVar4,
     uVar4 = uVar4 >> 8 | uVar4, iVar6 = (uVar4 >> 0x10 | uVar4) + 1, iVar6 <= olen)) {
    iVar6 = olen;
  }
  iVar5 = 0;
  bVar3 = false;
  if (iVar2 < iVar6) {
    if ((SBORROW4(iVar2 * 7,iVar1 * 8) == iVar2 * 7 + iVar1 * -8 < 0) &&
       (__dest = (uchar *)malloc((ulong)(iVar6 + 1)), __dest != (uchar *)0x0)) {
      if (iVar1 != 0) {
        memcpy(__dest,__ptr,(long)iVar1);
      }
      free(__ptr);
    }
    else {
      __dest = (uchar *)realloc(__ptr,(ulong)(iVar6 + 1));
      if ((__dest == (uchar *)0x0) &&
         (__dest = (uchar *)realloc(b->data,(ulong)(olen + 1)), iVar6 = olen, __dest == (uchar *)0x0
         )) {
        iVar5 = -1;
        bVar3 = false;
        goto LAB_00133f51;
      }
    }
    b->data = __dest;
    b->mlen = iVar6;
    iVar5 = b->slen;
    __dest[iVar5] = '\0';
    bVar3 = true;
  }
LAB_00133f51:
  if (bVar3) {
    return 0;
  }
  return iVar5;
}

Assistant:

int balloc (bstring b, int olen) {
	int len;
	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen <= 0 ||
	    b->mlen < b->slen || olen <= 0) {
		return BSTR_ERR;
	}

	if (olen >= b->mlen) {
		unsigned char * x;

		if ((len = snapUpSize (olen)) <= b->mlen) return BSTR_OK;

		/* Assume probability of a non-moving realloc is 0.125 */
		if (7 * b->mlen < 8 * b->slen) {

			/* If slen is close to mlen in size then use realloc to reduce
			   the memory defragmentation */

			reallocStrategy:;

			x = (unsigned char *) bstr__realloc (b->data, (size_t) len + 1);
			if (x == NULL) {

				/* Since we failed, try allocating the tighest possible
				   allocation */

				len = olen;
				x = (unsigned char *) bstr__realloc (b->data, (size_t) len + 1);
				if (NULL == x) {
					return BSTR_ERR;
				}
			}
		} else {

			/* If slen is not close to mlen then avoid the penalty of copying
			   the extra bytes that are allocated, but not considered part of
			   the string */

			if (NULL == (x = (unsigned char *) bstr__alloc ((size_t) len + 1))) {

				/* Perhaps there is no available memory for the two
				   allocations to be in memory at once */

				goto reallocStrategy;

			} else {
				if (b->slen) bstr__memcpy ((char *) x, (char *) b->data,
				                           (size_t) b->slen);
				bstr__free (b->data);
			}
		}
		b->data = x;
		b->mlen = len;
		b->data[b->slen] = (unsigned char) '\0';

#if defined (BSTRLIB_TEST_CANARY)
		if (len > b->slen + 1) {
			memchr (b->data + b->slen + 1, 'X', len - (b->slen + 1));
		}
#endif
	}

	return BSTR_OK;
}